

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

void __thiscall EOClient::Tick(EOClient *this)

{
  PacketState PVar1;
  World *pWVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  unsigned_long *puVar6;
  void *__ptr;
  EOServer *pEVar7;
  mapped_type *this_00;
  undefined1 *puVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  uchar *puVar12;
  uint local_1ec;
  byte local_189;
  char local_159;
  char *local_158;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  char local_141;
  char *local_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  char local_129;
  char *local_128;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  char local_111;
  ulong local_110;
  unsigned_long local_108;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  char *local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8 [32];
  string local_c8;
  undefined1 local_a8 [8];
  string empty;
  key_type local_80;
  size_t local_50;
  unsigned_long local_48;
  size_t local_40;
  size_t upload_available;
  int oldlength;
  int done;
  string data;
  EOClient *this_local;
  
  data.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&oldlength);
  upload_available._4_4_ = 0;
  if (this->upload_fh == (FILE *)0x0) {
    if (this->packet_state == ReadData) {
      local_1ec = this->length;
    }
    else {
      local_1ec = 1;
    }
    Client::Recv_abi_cxx11_(&local_c8,&this->super_Client,(ulong)local_1ec);
    std::__cxx11::string::operator=((string *)&oldlength,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
LAB_0015d459:
    while (lVar11 = std::__cxx11::string::length(), lVar11 != 0 && upload_available._4_4_ == 0) {
      PVar1 = this->packet_state;
      if (PVar1 == ReadLen1) goto LAB_0015d4cf;
      if (PVar1 == ReadLen2) goto LAB_0015d556;
      if (PVar1 == ReadData) goto LAB_0015d612;
      local_138._M_current =
           (char *)std::begin<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &oldlength);
      local_140 = (char *)std::end<std::__cxx11::string>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&oldlength);
      local_141 = '\0';
      std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_138,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_140,&local_141);
      local_150._M_current = (char *)std::begin<std::__cxx11::string>(&this->data);
      local_158 = (char *)std::end<std::__cxx11::string>(&this->data);
      local_159 = '\0';
      std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_150,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_158,&local_159);
      std::__cxx11::string::erase((ulong)&oldlength,0);
      std::__cxx11::string::erase((ulong)&this->data,0);
      this->packet_state = ReadLen1;
    }
  }
  else {
    local_48 = this->upload_size - this->upload_pos;
    local_50 = Client::SendBufferRemaining(&this->super_Client);
    puVar6 = std::min<unsigned_long>(&local_48,&local_50);
    local_40 = *puVar6;
    if (local_40 == 0) {
      if (this->upload_pos == this->upload_size) {
        sVar9 = Client::SendBufferRemaining(&this->super_Client);
        sVar10 = std::__cxx11::string::length();
        if (sVar9 == sVar10) {
          fclose((FILE *)this->upload_fh);
          this->upload_fh = (FILE *)0x0;
          this->upload_pos = 0;
          this->upload_size = 0;
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    (&(this->super_Client).send_buffer,&this->send_buffer2);
          std::swap<unsigned_long>(&(this->super_Client).send_buffer_gpos,&this->send_buffer2_gpos);
          std::swap<unsigned_long>(&(this->super_Client).send_buffer_ppos,&this->send_buffer2_ppos);
          std::swap<unsigned_long>(&(this->super_Client).send_buffer_used,&this->send_buffer2_used);
          std::__cxx11::string::string((string *)local_a8);
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    (&this->send_buffer2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
    }
    else {
      __ptr = (void *)std::__cxx11::string::operator[]((ulong)&(this->super_Client).send_buffer);
      local_40 = fread(__ptr,1,local_40,(FILE *)this->upload_fh);
      empty.field_2._M_local_buf[0xe] = '\0';
      empty.field_2._M_local_buf[0xd] = '\0';
      local_189 = 0;
      if (this->upload_type == FILE_MAP) {
        pEVar7 = server(this);
        pWVar2 = pEVar7->world;
        std::allocator<char>::allocator();
        empty.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"GlobalPK",
                   (allocator<char> *)(empty.field_2._M_local_buf + 0xf));
        empty.field_2._M_local_buf[0xd] = '\x01';
        this_00 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ::operator[](&(pWVar2->config).
                                super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               ,&local_80);
        bVar3 = util::variant::operator_cast_to_bool(this_00);
        local_189 = 0;
        if (bVar3) {
          pEVar7 = server(this);
          bVar3 = World::PKExcept(pEVar7->world,(int)this->player->character->mapid);
          local_189 = bVar3 ^ 0xff;
        }
      }
      if ((empty.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_80);
      }
      if ((empty.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(empty.field_2._M_local_buf + 0xf));
      }
      if ((local_189 & 1) != 0) {
        if ((this->upload_pos < 4) && (3 < this->upload_pos + local_40)) {
          puVar8 = (undefined1 *)
                   std::__cxx11::string::operator[]((ulong)&(this->super_Client).send_buffer);
          *puVar8 = 0xff;
        }
        if ((this->upload_pos < 4) && (4 < this->upload_pos + local_40)) {
          puVar8 = (undefined1 *)
                   std::__cxx11::string::operator[]((ulong)&(this->super_Client).send_buffer);
          *puVar8 = 1;
        }
        if ((this->upload_pos < 0x20) && (0x1f < this->upload_pos + local_40)) {
          puVar8 = (undefined1 *)
                   std::__cxx11::string::operator[]((ulong)&(this->super_Client).send_buffer);
          *puVar8 = 4;
        }
      }
      this->upload_pos = local_40 + this->upload_pos;
      (this->super_Client).send_buffer_ppos = local_40 + (this->super_Client).send_buffer_ppos;
      (this->super_Client).send_buffer_used = local_40 + (this->super_Client).send_buffer_used;
    }
  }
  std::__cxx11::string::~string((string *)&oldlength);
  return;
LAB_0015d4cf:
  puVar12 = (uchar *)std::__cxx11::string::operator[]((ulong)&oldlength);
  this->raw_length[0] = *puVar12;
  puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&oldlength);
  *puVar8 = 0;
  std::__cxx11::string::erase((ulong)&oldlength,0);
  this->packet_state = ReadLen2;
  lVar11 = std::__cxx11::string::length();
  if (lVar11 != 0) {
LAB_0015d556:
    puVar12 = (uchar *)std::__cxx11::string::operator[]((ulong)&oldlength);
    this->raw_length[1] = *puVar12;
    puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&oldlength);
    *puVar8 = 0;
    std::__cxx11::string::erase((ulong)&oldlength,0);
    uVar4 = PacketProcessor::Number(this->raw_length[0],this->raw_length[1],0xfe,0xfe);
    this->length = uVar4;
    this->packet_state = ReadData;
    lVar11 = std::__cxx11::string::length();
    if (lVar11 != 0) {
LAB_0015d612:
      upload_available._0_4_ = std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_e8,(ulong)&oldlength);
      std::__cxx11::string::operator+=((string *)&this->data,local_e8);
      std::__cxx11::string::~string(local_e8);
      local_f0._M_current = (char *)std::__cxx11::string::begin();
      local_100._M_current = (char *)std::__cxx11::string::begin();
      local_108 = std::__cxx11::string::length();
      local_110 = (ulong)this->length;
      puVar6 = std::min<unsigned_long>(&local_108,&local_110);
      local_f8 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_100,*puVar6);
      local_111 = '\0';
      std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_f0,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_f8,&local_111);
      std::__cxx11::string::erase((ulong)&oldlength,0);
      iVar5 = std::__cxx11::string::length();
      this->length = this->length - (iVar5 - (int)upload_available);
      if (this->length == 0) {
        Execute(this,&this->data);
        local_120._M_current = (char *)std::begin<std::__cxx11::string>(&this->data);
        local_128 = (char *)std::end<std::__cxx11::string>(&this->data);
        local_129 = '\0';
        std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_120,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_128,&local_129);
        std::__cxx11::string::erase((ulong)&this->data,0);
        this->packet_state = ReadLen1;
        upload_available._4_4_ = 1;
      }
    }
  }
  goto LAB_0015d459;
}

Assistant:

void EOClient::Tick()
{
	std::string data;
	int done = false;
	int oldlength;

	if (this->upload_fh)
	{
		// Send more of the file instead of doing other tasks
		std::size_t upload_available = std::min(this->upload_size - this->upload_pos, Client::SendBufferRemaining());

		if (upload_available != 0)
		{
			upload_available = std::fread(&this->send_buffer[this->send_buffer_ppos], 1, upload_available, this->upload_fh);

			// Dynamically rewrite the bytes of the map to enable PK
			if (this->upload_type == FILE_MAP && this->server()->world->config["GlobalPK"] && !this->server()->world->PKExcept(player->character->mapid))
			{
				if (this->upload_pos <= 0x03 && this->upload_pos + upload_available > 0x03)
					this->send_buffer[this->send_buffer_ppos + 0x03 - this->upload_pos] = 0xFF;

				if (this->upload_pos <= 0x03 && this->upload_pos + upload_available > 0x04)
					this->send_buffer[this->send_buffer_ppos + 0x04 - this->upload_pos] = 0x01;

				if (this->upload_pos <= 0x1F && this->upload_pos + upload_available > 0x1F)
					this->send_buffer[this->send_buffer_ppos + 0x1F - this->upload_pos] = 0x04;
			}

			this->upload_pos += upload_available;
			this->send_buffer_ppos += upload_available;
			this->send_buffer_used += upload_available;
		}
		else if (this->upload_pos == this->upload_size && this->SendBufferRemaining() == this->send_buffer.length())
		{
			using std::swap;

			std::fclose(this->upload_fh);
			this->upload_fh = 0;
			this->upload_pos = 0;
			this->upload_size = 0;

			// Place our temporary buffer back as the real one
			swap(this->send_buffer, this->send_buffer2);
			swap(this->send_buffer_gpos, this->send_buffer2_gpos);
			swap(this->send_buffer_ppos, this->send_buffer2_ppos);
			swap(this->send_buffer_used, this->send_buffer2_used);

			// We're not using this anymore...
			std::string empty;
			swap(this->send_buffer2, empty);
		}
	}
	else
	{
		data = this->Recv((this->packet_state == EOClient::ReadData) ? this->length : 1);

		while (data.length() > 0 && !done)
		{
			switch (this->packet_state)
			{
				case EOClient::ReadLen1:
					this->raw_length[0] = data[0];
					data[0] = '\0';
					data.erase(0, 1);
					this->packet_state = EOClient::ReadLen2;

					if (data.length() == 0)
					{
						break;
					}

				case EOClient::ReadLen2:
					this->raw_length[1] = data[0];
					data[0] = '\0';
					data.erase(0, 1);
					this->length = PacketProcessor::Number(this->raw_length[0], this->raw_length[1]);
					this->packet_state = EOClient::ReadData;

					if (data.length() == 0)
					{
						break;
					}

				case EOClient::ReadData:
					oldlength = this->data.length();
					this->data += data.substr(0, this->length);
					std::fill(data.begin(), data.begin() + std::min<std::size_t>(data.length(), this->length), '\0');
					data.erase(0, this->length);
					this->length -= this->data.length() - oldlength;

					if (this->length == 0)
					{
						this->Execute(this->data);

						std::fill(UTIL_RANGE(this->data), '\0');
						this->data.erase();
						this->packet_state = EOClient::ReadLen1;

						done = true;
					}
					break;

				default:
					// If the code ever gets here, something is broken, so we just reset the client's state.
					std::fill(UTIL_RANGE(data), '\0');
					std::fill(UTIL_RANGE(this->data), '\0');
					data.erase();
					this->data.erase();
					this->packet_state = EOClient::ReadLen1;
			}
		}
	}
}